

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BroadcastToLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttolike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x44c) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x44c;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    BroadcastToLikeLayerParams::BroadcastToLikeLayerParams(this_00.broadcasttolike_);
    (this->layer_).broadcasttolike_ = (BroadcastToLikeLayerParams *)this_00;
  }
  return (BroadcastToLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToLikeLayerParams* NeuralNetworkLayer::mutable_broadcasttolike() {
  if (!has_broadcasttolike()) {
    clear_layer();
    set_has_broadcasttolike();
    layer_.broadcasttolike_ = new ::CoreML::Specification::BroadcastToLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToLike)
  return layer_.broadcasttolike_;
}